

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_pivot.cpp
# Opt level: O2

unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> __thiscall
duckdb::Transformer::TransformPivot(Transformer *this,PGPivotExpr *root)

{
  bool bVar1;
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var2;
  PGList *list;
  pointer pbVar3;
  pointer pbVar4;
  PGAlias *root_00;
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var5;
  pointer pPVar6;
  type ref;
  ParserException *pPVar7;
  long lVar8;
  pointer pPVar9;
  long in_RDX;
  pointer pPVar10;
  unsigned_long params;
  allocator local_61;
  _Head_base<0UL,_duckdb::PivotRef_*,_false> local_60;
  _Head_base<0UL,_duckdb::TableRef_*,_false> local_58;
  _Head_base<0UL,_duckdb::TableRef_*,_false> local_38;
  
  make_uniq<duckdb::PivotRef>();
  TransformTableRefNode((Transformer *)&stack0xffffffffffffffa8,(PGNode *)root);
  pPVar6 = unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>::operator->
                     ((unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true> *)
                      &local_60);
  _Var5._M_head_impl = local_58._M_head_impl;
  local_58._M_head_impl = (TableRef *)0x0;
  _Var2._M_head_impl =
       (pPVar6->source).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>.
       _M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
       super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
  (pPVar6->source).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
  super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
  super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = _Var5._M_head_impl;
  if (_Var2._M_head_impl != (TableRef *)0x0) {
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_TableRef + 8))();
    if ((Transformer *)local_58._M_head_impl != (Transformer *)0x0) {
      (**(code **)(*(long *)local_58._M_head_impl + 8))();
    }
  }
  list = *(PGList **)(in_RDX + 0x10);
  local_38._M_head_impl = (TableRef *)this;
  if (list != (PGList *)0x0) {
    pPVar6 = unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>::operator->
                       ((unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true> *
                        )&local_60);
    TransformExpressionList((Transformer *)root,list,&pPVar6->aggregates);
  }
  if (*(PGList **)(in_RDX + 0x18) != (PGList *)0x0) {
    TransformStringList_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)&stack0xffffffffffffffa8,(Transformer *)root,*(PGList **)(in_RDX + 0x18));
    pPVar6 = unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>::operator->
                       ((unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true> *
                        )&local_60);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_move_assign((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&pPVar6->unpivot_names,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&stack0xffffffffffffffa8);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&stack0xffffffffffffffa8);
  }
  pPVar6 = unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>::operator->
                     ((unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true> *)
                      &local_60);
  pbVar3 = (pPVar6->unpivot_names).
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar4 = (pPVar6->unpivot_names).
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  TransformPivotList((vector<duckdb::PivotColumn,_true> *)&stack0xffffffffffffffa8,
                     (Transformer *)root,*(PGList **)(in_RDX + 0x20),pbVar3 == pbVar4);
  pPVar6 = unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>::operator->
                     ((unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true> *)
                      &local_60);
  ::std::vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>::_M_move_assign
            (&(pPVar6->pivots).
              super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>,
             (vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_> *)
             &stack0xffffffffffffffa8);
  ::std::vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>::~vector
            ((vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_> *)
             &stack0xffffffffffffffa8);
  if (pbVar3 != pbVar4) {
    pPVar6 = unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>::operator->
                       ((unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true> *
                        )&local_60);
    lVar8 = (long)(pPVar6->pivots).
                  super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
                  super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(pPVar6->pivots).
                  super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
                  super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    if (1 < (ulong)(lVar8 / 0x70)) {
      pPVar7 = (ParserException *)__cxa_allocate_exception(0x10,0x70,lVar8 % 0x70);
      ::std::__cxx11::string::string
                ((string *)&stack0xffffffffffffffa8,"UNPIVOT requires a single pivot element",
                 &local_61);
      ParserException::ParserException(pPVar7,(string *)&stack0xffffffffffffffa8);
      __cxa_throw(pPVar7,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  if (*(PGList **)(in_RDX + 0x28) != (PGList *)0x0) {
    TransformStringList_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)&stack0xffffffffffffffa8,(Transformer *)root,*(PGList **)(in_RDX + 0x28));
    pPVar6 = unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>::operator->
                       ((unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true> *
                        )&local_60);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_move_assign((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&pPVar6->groups,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&stack0xffffffffffffffa8);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&stack0xffffffffffffffa8);
  }
  pPVar6 = unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>::operator->
                     ((unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true> *)
                      &local_60);
  pPVar9 = (pPVar6->pivots).super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
           super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>._M_impl.
           super__Vector_impl_data._M_start;
  do {
    if (pPVar9 == (pPVar6->pivots).
                  super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
                  super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
      bVar1 = *(bool *)(in_RDX + 0x38);
      pPVar6 = unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>::operator->
                         ((unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>
                           *)&local_60);
      pPVar6->include_nulls = bVar1;
      root_00 = *(PGAlias **)(in_RDX + 0x30);
      pPVar6 = unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>::operator->
                         ((unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>
                           *)&local_60);
      TransformAlias((string *)&stack0xffffffffffffffa8,(Transformer *)root,root_00,
                     &(pPVar6->super_TableRef).column_name_alias);
      pPVar6 = unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>::operator->
                         ((unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>
                           *)&local_60);
      ::std::__cxx11::string::operator=
                ((string *)&(pPVar6->super_TableRef).alias,(string *)&stack0xffffffffffffffa8);
      ::std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
      ref = unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>::operator*
                      ((unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true> *)
                       &local_60);
      SetQueryLocation(&ref->super_TableRef,*(int *)(in_RDX + 0x3c));
      *(PivotRef **)local_38._M_head_impl = local_60._M_head_impl;
      return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
             (_Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>)
             local_38._M_head_impl;
    }
    if (pbVar3 == pbVar4) {
      params = (long)(pPVar9->pivot_expressions).
                     super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(pPVar9->pivot_expressions).
                     super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3;
      for (pPVar10 = (pPVar9->entries).
                     super_vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
                     .
                     super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pPVar10 !=
          (pPVar9->entries).
          super_vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
          super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
          _M_impl.super__Vector_impl_data._M_finish; pPVar10 = pPVar10 + 1) {
        if ((pPVar10->expr).
            super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            ._M_t.
            super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
            .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
            (ParsedExpression *)0x0) {
          pPVar7 = (ParserException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&stack0xffffffffffffffa8,
                     "PIVOT IN list must contain columns or lists of columns - expressions are only supported for UNPIVOT"
                     ,&local_61);
          ParserException::ParserException(pPVar7,(string *)&stack0xffffffffffffffa8);
          __cxa_throw(pPVar7,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
        }
        if ((long)(pPVar10->values).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(pPVar10->values).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                  super__Vector_impl_data._M_start >> 6 != params) {
          pPVar7 = (ParserException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&stack0xffffffffffffffa8,
                     "PIVOT IN list - inconsistent amount of rows - expected %d but got %d",
                     &local_61);
          ParserException::ParserException<unsigned_long,unsigned_long>
                    (pPVar7,(string *)&stack0xffffffffffffffa8,params,
                     (long)(pPVar10->values).
                           super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)(pPVar10->values).
                           super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl
                           .super__Vector_impl_data._M_start >> 6);
          __cxa_throw(pPVar7,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
    }
    else if ((long)(pPVar9->unpivot_names).
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(pPVar9->unpivot_names).
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start != 0x20) {
      pPVar7 = (ParserException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&stack0xffffffffffffffa8,
                 "UNPIVOT requires a single column name for the PIVOT IN clause",&local_61);
      ParserException::ParserException(pPVar7,(string *)&stack0xffffffffffffffa8);
      __cxa_throw(pPVar7,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pPVar9 = pPVar9 + 1;
  } while( true );
}

Assistant:

unique_ptr<TableRef> Transformer::TransformPivot(duckdb_libpgquery::PGPivotExpr &root) {
	auto result = make_uniq<PivotRef>();
	result->source = TransformTableRefNode(*root.source);
	if (root.aggrs) {
		TransformExpressionList(*root.aggrs, result->aggregates);
	}
	if (root.unpivots) {
		result->unpivot_names = TransformStringList(root.unpivots);
	}
	auto is_pivot = result->unpivot_names.empty();
	result->pivots = TransformPivotList(*root.pivots, is_pivot);
	if (!is_pivot && result->pivots.size() > 1) {
		throw ParserException("UNPIVOT requires a single pivot element");
	}
	if (root.groups) {
		result->groups = TransformStringList(root.groups);
	}
	for (auto &pivot : result->pivots) {
		if (!is_pivot) {
			// unpivot
			if (pivot.unpivot_names.size() != 1) {
				throw ParserException("UNPIVOT requires a single column name for the PIVOT IN clause");
			}
			D_ASSERT(pivot.pivot_expressions.empty());
		} else {
			// pivot
			auto expected_size = pivot.pivot_expressions.size();
			D_ASSERT(pivot.unpivot_names.empty());
			for (auto &entry : pivot.entries) {
				if (entry.expr) {
					throw ParserException("PIVOT IN list must contain columns or lists of columns - expressions are "
					                      "only supported for UNPIVOT");
				}
				if (entry.values.size() != expected_size) {
					throw ParserException("PIVOT IN list - inconsistent amount of rows - expected %d but got %d",
					                      expected_size, entry.values.size());
				}
			}
		}
	}
	result->include_nulls = root.include_nulls;
	result->alias = TransformAlias(root.alias, result->column_name_alias);
	SetQueryLocation(*result, root.location);
	return std::move(result);
}